

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerHLSL::to_semantic_abi_cxx11_
          (string *__return_storage_ptr__,CompilerHLSL *this,uint32_t location,ExecutionModel em,
          StorageClass sc)

{
  HLSLVertexAttributeRemap *pHVar1;
  long lVar2;
  uint *puVar3;
  undefined4 in_register_0000000c;
  uint *ts_1;
  uint32_t local_c;
  
  ts_1 = (uint *)CONCAT44(in_register_0000000c,em);
  local_c = location;
  if ((sc == Input && em == ExecutionModelVertex) &&
     (ts_1 = (uint *)(this->remap_vertex_attributes).
                     super_VectorView<spirv_cross::HLSLVertexAttributeRemap>.buffer_size,
     ts_1 != (uint *)0x0)) {
    pHVar1 = (this->remap_vertex_attributes).super_VectorView<spirv_cross::HLSLVertexAttributeRemap>
             .ptr;
    puVar3 = (uint *)((long)ts_1 * 0x28);
    ts_1 = (uint *)0x0;
    do {
      if (*(uint32_t *)((long)&pHVar1->location + (long)ts_1) == location) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        lVar2 = *(long *)((long)&(pHVar1->semantic)._M_dataplus._M_p + (long)ts_1);
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,lVar2,
                   *(long *)((long)&(pHVar1->semantic)._M_string_length + (long)ts_1) + lVar2);
        return __return_storage_ptr__;
      }
      ts_1 = ts_1 + 10;
    } while (puVar3 != ts_1);
  }
  join<char_const(&)[9],unsigned_int&>
            (__return_storage_ptr__,(spirv_cross *)"TEXCOORD",(char (*) [9])&local_c,ts_1);
  return __return_storage_ptr__;
}

Assistant:

std::string CompilerHLSL::to_semantic(uint32_t location, ExecutionModel em, StorageClass sc)
{
	if (em == ExecutionModelVertex && sc == StorageClassInput)
	{
		// We have a vertex attribute - we should look at remapping it if the user provided
		// vertex attribute hints.
		for (auto &attribute : remap_vertex_attributes)
			if (attribute.location == location)
				return attribute.semantic;
	}

	// Not a vertex attribute, or no remap_vertex_attributes entry.
	return join("TEXCOORD", location);
}